

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O3

float * Tim_ManGetArrTimes(Tim_Man_t *p)

{
  size_t __size;
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  
  uVar1 = p->nCis;
  if ((int)uVar1 < 1) {
    uVar4 = 0;
  }
  else {
    pfVar2 = &p->pCis->timeArr;
    uVar4 = 0;
    do {
      if ((p->pCis == (Tim_Obj_t *)0x0) ||
         (((int)pfVar2[-2] < 0 && ((*pfVar2 != 0.0 || (NAN(*pfVar2))))))) goto LAB_0041dfc4;
      uVar4 = uVar4 + 1;
      pfVar2 = pfVar2 + 6;
    } while (uVar1 != uVar4);
    uVar4 = (ulong)uVar1;
  }
LAB_0041dfc4:
  if ((p->vBoxes != (Vec_Ptr_t *)0x0) && (p->vBoxes->nSize != 0)) {
    uVar1 = Tim_ManBoxOutputFirst(p,0);
  }
  if ((uint)uVar4 == uVar1) {
    pfVar2 = (float *)0x0;
  }
  else {
    uVar1 = p->nCis;
    __size = (long)(int)uVar1 * 4;
    pfVar2 = (float *)malloc(__size);
    memset(pfVar2,0xff,__size);
    if ((0 < (long)(int)uVar1) && (p->pCis != (Tim_Obj_t *)0x0)) {
      pfVar3 = &p->pCis->timeArr;
      uVar4 = 0;
      do {
        if ((int)pfVar3[-2] < 0) {
          pfVar2[uVar4] = *pfVar3;
        }
        uVar4 = uVar4 + 1;
        pfVar3 = pfVar3 + 6;
      } while (uVar1 != uVar4);
    }
  }
  return pfVar2;
}

Assistant:

float * Tim_ManGetArrTimes( Tim_Man_t * p )
{
    float * pTimes;
    Tim_Obj_t * pObj;
    int i;
    Tim_ManForEachPi( p, pObj, i )
        if ( pObj->timeArr != 0.0 )
            break;
    if ( i == Tim_ManPiNum(p) )
        return NULL;
    pTimes  = ABC_FALLOC( float, Tim_ManCiNum(p) );
    Tim_ManForEachPi( p, pObj, i )
        pTimes[i] = pObj->timeArr;
    return pTimes;
}